

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::~vector
          (vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *this)

{
  vq_node *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  if (*(long *)(in_RDI->m_centroid).m_s != 0) {
    scalar_type<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::destruct_array
              (in_RDI,in_stack_ffffffffffffffec);
    crnlib_free((void *)0x17f198);
  }
  return;
}

Assistant:

inline ~vector() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
    }
  }